

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O2

int annotation_final_check(lys_ext_instance *ext)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  lys_ext_instance *plVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  
  puVar7 = (undefined8 *)lys_ext_complex_get_substmt(0x30,ext,0);
  if (*(int *)*puVar7 == 9) {
    lyext_log(ext->module->ctx,0,"Annotations","annotation_final_check",
              "The leafref type is not supported for annotations (annotation %s).",ext->arg_value);
  }
  else {
    uVar4._0_2_ = ext->flags;
    uVar4._2_1_ = ext->ext_size;
    uVar4._3_1_ = ext->insubstmt_index;
    if ((uVar4 >> 8 & 1) != 0) {
      ext->flags = (undefined2)uVar4 & 0xfeff;
      return 0;
    }
    lVar8 = lys_main_module(ext->parent);
    bVar2 = *(byte *)(lVar8 + 0x50);
    bVar9 = 0;
    for (uVar10 = 0; bVar2 != uVar10; uVar10 = uVar10 + 1) {
      plVar5 = *(lys_ext_instance **)(*(long *)(lVar8 + 0xa0) + uVar10 * 8);
      if ((plVar5->def == ext->def) && (plVar5->arg_value == ext->arg_value)) {
        if (plVar5 != ext) {
          pbVar1 = (byte *)((long)&plVar5->flags + 1);
          *pbVar1 = *pbVar1 | 1;
        }
        bVar9 = bVar9 + 1;
      }
    }
    bVar2 = *(byte *)(lVar8 + 0x46);
    for (uVar10 = 0; uVar10 != bVar2; uVar10 = uVar10 + 1) {
      lVar6 = *(long *)(*(long *)(lVar8 + 0x68) + uVar10 * 0x30);
      bVar3 = *(byte *)(lVar6 + 0x50);
      for (uVar11 = 0; bVar3 != uVar11; uVar11 = uVar11 + 1) {
        plVar5 = *(lys_ext_instance **)(*(long *)(lVar6 + 0xa0) + uVar11 * 8);
        if ((plVar5->def == ext->def) && (plVar5->arg_value == ext->arg_value)) {
          if (plVar5 != ext) {
            pbVar1 = (byte *)((long)&plVar5->flags + 1);
            *pbVar1 = *pbVar1 | 1;
          }
          bVar9 = bVar9 + 1;
        }
      }
    }
    if (bVar9 < 2) {
      return 0;
    }
    lyext_log(ext->module->ctx,0,"Annotations","annotation_final_check",
              "Annotation instance %s is not unique, there are %d instances with the same name in module %s."
              ,ext->arg_value,bVar9,*(undefined8 *)((long)ext->parent + 8));
  }
  return 1;
}

Assistant:

int
annotation_final_check(struct lys_ext_instance *ext)
{
    uint8_t  i, j, c;
    struct lys_module *mod;
    struct lys_submodule *submod;
    struct lys_type *type;

    /*
     * check type - leafref is not allowed
     */
    type = *(struct lys_type**)lys_ext_complex_get_substmt(LY_STMT_TYPE, (struct lys_ext_instance_complex *)ext, NULL);
    if (type->base == LY_TYPE_LEAFREF) {
        LYEXT_LOG(ext->module->ctx, LY_LLERR, "Annotations", "The leafref type is not supported for annotations (annotation %s).",
                  ext->arg_value);
        return 1;
    }

    /*
     * check duplication
     */
    if (ext->flags & LYEXT_OPT_PLUGIN1) {
        /* already checked */
        ext->flags &= ~LYEXT_OPT_PLUGIN1;
        return 0;
    }

    mod = lys_main_module((struct lys_module *)ext->parent);

    for (i = c = 0; i < mod->ext_size; i++) {
        /* note, that it is not necessary to check also ext->insubstmt since
         * annotation_position() ensures that annotation instances are placed only
         * in module or submodule */
        if (mod->ext[i]->def == ext->def && mod->ext[i]->arg_value == ext->arg_value) {
            if (mod->ext[i] != ext) {
                /* do not mark the instance being checked */
                mod->ext[i]->flags |= LYEXT_OPT_PLUGIN1;
            }
            c++;
        }
    }
    /* similarly, go through the all extensions in the main module submodules */
    for (j = 0; j < mod->inc_size; j++) {
        submod = mod->inc[j].submodule; /* shortcut */
        for (i = 0; i < submod->ext_size; i++) {
            if (submod->ext[i]->def == ext->def && submod->ext[i]->arg_value == ext->arg_value) {
                if (submod->ext[i] != ext) {
                    /* do not mark the instance being checked */
                    submod->ext[i]->flags |= LYEXT_OPT_PLUGIN1;
                }
                c++;
            }
        }
    }

    if (c > 1) {
        LYEXT_LOG(ext->module->ctx, LY_LLERR, "Annotations",
                  "Annotation instance %s is not unique, there are %d instances with the same name in module %s.",
                  ext->arg_value, c, ((struct lys_module *)ext->parent)->name);
        return 1;
    } else {
        return 0;
    }
}